

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCutGeneration.cpp
# Opt level: O2

bool __thiscall
HighsCutGeneration::generateCut
          (HighsCutGeneration *this,HighsTransformedLp *transLp,
          vector<int,_std::allocator<int>_> *inds_,vector<double,_std::allocator<double>_> *vals_,
          double *rhs_,bool onlyInitialCMIRScale)

{
  pointer piVar1;
  pointer puVar2;
  double *pdVar3;
  HighsInt *pHVar4;
  long lVar5;
  double *rhs;
  bool bVar6;
  bool bVar7;
  HighsInt HVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  undefined7 in_register_00000089;
  HighsInt i;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  bool hasContinuous;
  bool hasGeneralInts;
  bool hasUnboundedInts;
  bool intsPositive;
  undefined4 local_3c;
  double *local_38;
  
  intsPositive = true;
  bVar6 = HighsTransformedLp::transform
                    (transLp,vals_,&this->upper,&this->solval,inds_,rhs_,&intsPositive,false);
  if (bVar6) {
    local_3c = (undefined4)CONCAT71(in_register_00000089,onlyInitialCMIRScale);
    piVar1 = (inds_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    this->rowlen = (HighsInt)
                   ((ulong)((long)(inds_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_finish - (long)piVar1) >> 2);
    this->inds = piVar1;
    this->vals = (vals_->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
    (this->rhs).hi = *rhs_;
    (this->rhs).lo = 0.0;
    puVar2 = (this->complementation).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->complementation).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish != puVar2) {
      (this->complementation).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = puVar2;
    }
    hasUnboundedInts = false;
    hasGeneralInts = false;
    hasContinuous = false;
    bVar7 = preprocessBaseInequality(this,&hasUnboundedInts,&hasGeneralInts,&hasContinuous);
    bVar6 = hasUnboundedInts;
    if (!bVar7) {
      return false;
    }
    local_38 = rhs_;
    if ((hasUnboundedInts == false) && (intsPositive == false)) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&this->complementation,(long)this->rowlen);
      for (uVar11 = 0; uVar11 != (uint)this->rowlen; uVar11 = uVar11 + 1) {
        if ((this->vals[uVar11] <= 0.0) &&
           ((this->isintegral).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar11] != '\0')) {
          flipComplementation(this,(HighsInt)uVar11);
        }
      }
    }
    bVar6 = tryGenerateCut(this,inds_,vals_,bVar6,hasGeneralInts,hasContinuous,this->feastol * 10.0,
                           local_3c._0_1_,true,true);
    if (bVar6) {
      removeComplementation(this);
      rhs = local_38;
      uVar9 = (ulong)(uint)this->rowlen;
      pdVar3 = this->vals;
      pHVar4 = this->inds;
      uVar11 = uVar9;
      while( true ) {
        iVar10 = (int)uVar11;
        if ((int)uVar9 < 1) break;
        lVar5 = uVar9 - 1;
        uVar9 = uVar9 - 1;
        if ((pdVar3[lVar5] == 0.0) && (!NAN(pdVar3[lVar5]))) {
          this->rowlen = iVar10 + -1;
          pHVar4[uVar9] = pHVar4[(long)iVar10 - 1];
          uVar11 = (ulong)this->rowlen;
          pdVar3[uVar9] = pdVar3[uVar11];
        }
      }
      *local_38 = (this->rhs).hi + (this->rhs).lo;
      std::vector<double,_std::allocator<double>_>::resize(vals_,(long)iVar10);
      std::vector<int,_std::allocator<int>_>::resize(inds_,(long)this->rowlen);
      bVar6 = HighsTransformedLp::untransform(transLp,vals_,inds_,rhs,false);
      if (!bVar6) {
        return false;
      }
      piVar1 = (inds_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      this->rowlen = (HighsInt)
                     ((ulong)((long)(inds_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_finish - (long)piVar1) >> 2);
      this->inds = piVar1;
      this->vals = (vals_->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
      (this->rhs).hi = *rhs;
      (this->rhs).lo = 0.0;
      bVar6 = postprocessCut(this);
      if (bVar6) {
        *rhs = (this->rhs).hi + (this->rhs).lo;
        std::vector<double,_std::allocator<double>_>::resize(vals_,(long)this->rowlen);
        std::vector<int,_std::allocator<int>_>::resize(inds_,(long)this->rowlen);
        dVar13 = 0.0;
        dVar12 = -*rhs;
        for (uVar11 = 0; (uint)this->rowlen != uVar11; uVar11 = uVar11 + 1) {
          dVar14 = (this->lpRelaxation->lpsolver).solution_.col_value.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[this->inds[uVar11]] *
                   (vals_->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar11];
          dVar15 = dVar12 + dVar14;
          dVar13 = dVar13 + (dVar12 - (dVar15 - dVar14)) + (dVar14 - (dVar15 - (dVar15 - dVar14)));
          dVar12 = dVar15;
        }
        if (this->feastol * 10.0 < dVar13 + dVar12) {
          HighsDomain::tightenCoefficients
                    ((HighsDomain *)
                     ((long)(this->lpRelaxation->mipsolver->mipdata_)._M_t.
                            super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                            .super__Head_base<0UL,_HighsMipSolverData_*,_false> + 0x390),this->inds,
                     this->vals,this->rowlen,rhs);
          pHVar4 = (inds_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          HVar8 = HighsCutPool::addCut
                            (this->cutpool,this->lpRelaxation->mipsolver,pHVar4,
                             (vals_->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start,
                             (HighsInt)
                             ((ulong)((long)(inds_->super__Vector_base<int,_std::allocator<int>_>).
                                            _M_impl.super__Vector_impl_data._M_finish - (long)pHVar4
                                     ) >> 2),*rhs,
                             (bool)(this->integralCoefficients & this->integralSupport),true,true,
                             false);
          return HVar8 != -1;
        }
      }
    }
  }
  return false;
}

Assistant:

bool HighsCutGeneration::generateCut(HighsTransformedLp& transLp,
                                     std::vector<HighsInt>& inds_,
                                     std::vector<double>& vals_, double& rhs_,
                                     bool onlyInitialCMIRScale) {
#if 0
  if (vals_.size() > 1) {
    std::vector<HighsInt> indsCheck_ = inds_;
    std::vector<double> valsCheck_ = vals_;
    double tmprhs_ = rhs_;
    bool intsPositive = true;
    if (!transLp.transform(valsCheck_, upper, solval, indsCheck_, tmprhs_,
                           intsPositive))
      return false;

    rowlen = indsCheck_.size();
    this->inds = indsCheck_.data();
    this->vals = valsCheck_.data();
    this->rhs = tmprhs_;
    complementation.clear();
    bool hasUnboundedInts = false;
    bool hasGeneralInts = false;
    bool hasContinuous = false;
    // printf("before preprocessing of base inequality:\n");
    checkNumerics(vals, rowlen, double(rhs));
    if (!preprocessBaseInequality(hasUnboundedInts, hasGeneralInts,
                                  hasContinuous))
      return false;
    // printf("after preprocessing of base inequality:\n");
    checkNumerics(vals, rowlen, double(rhs));

    tmprhs_ = (double)rhs;
    valsCheck_.resize(rowlen);
    indsCheck_.resize(rowlen);
    if (!transLp.untransform(valsCheck_, indsCheck_, tmprhs_)) return false;

    // printf("after untransform of base inequality:\n");
    checkNumerics(vals, rowlen, double(rhs));

    // finally check whether the cut is violated
    rowlen = indsCheck_.size();
    inds = indsCheck_.data();
    vals = valsCheck_.data();
    lpRelaxation.getMipSolver().mipdata_->debugSolution.checkCut(
        inds, vals, rowlen, tmprhs_);
  }
#endif

  bool intsPositive = true;
  if (!transLp.transform(vals_, upper, solval, inds_, rhs_, intsPositive))
    return false;

  rowlen = inds_.size();
  this->inds = inds_.data();
  this->vals = vals_.data();
  this->rhs = rhs_;
  complementation.clear();
  bool hasUnboundedInts = false;
  bool hasGeneralInts = false;
  bool hasContinuous = false;
  if (!preprocessBaseInequality(hasUnboundedInts, hasGeneralInts,
                                hasContinuous))
    return false;

  // it can happen that there is an unbounded integer variable during the
  // transform call so that the integers are not transformed to positive values.
  // Now the call to preprocessBaseInequality may have removed the unbounded
  // integer, e.g. due to a small coefficient value, so that we can still use
  // the lifted inequalities instead of cmir. We need to make sure, however,
  // that the cut values are transformed to positive coefficients first, which
  // we do below.
  if (!hasUnboundedInts && !intsPositive) {
    complementation.resize(rowlen);

    for (HighsInt i = 0; i != rowlen; ++i) {
      if (vals[i] > 0 || !isintegral[i]) continue;

      flipComplementation(i);
    }
  }

  // try to generate a cut
  if (!tryGenerateCut(inds_, vals_, hasUnboundedInts, hasGeneralInts,
                      hasContinuous, 10 * feastol, onlyInitialCMIRScale))
    return false;

  // remove the complementation if exists
  removeComplementation();

  // remove zeros in place
  for (HighsInt i = rowlen - 1; i >= 0; --i) {
    if (vals[i] == 0.0) {
      --rowlen;
      inds[i] = inds[rowlen];
      vals[i] = vals[rowlen];
    }
  }

  // transform the cut back into the original space, i.e. remove the bound
  // substitution and replace implicit slack variables
  rhs_ = (double)rhs;
  vals_.resize(rowlen);
  inds_.resize(rowlen);
  if (!transLp.untransform(vals_, inds_, rhs_)) return false;

  rowlen = inds_.size();
  inds = inds_.data();
  vals = vals_.data();
  rhs = rhs_;

  lpRelaxation.getMipSolver().mipdata_->debugSolution.checkCut(inds, vals,
                                                               rowlen, rhs_);
  // apply cut postprocessing including scaling and removal of small
  // coefficients
  if (!postprocessCut()) return false;
  rhs_ = (double)rhs;
  vals_.resize(rowlen);
  inds_.resize(rowlen);

  lpRelaxation.getMipSolver().mipdata_->debugSolution.checkCut(
      inds_.data(), vals_.data(), rowlen, rhs_);

  // finally determine the violation of the cut in the original space
  HighsCDouble violation = -rhs_;
  const auto& sol = lpRelaxation.getSolution().col_value;
  for (HighsInt i = 0; i != rowlen; ++i) violation += sol[inds[i]] * vals_[i];

  if (violation <= 10 * feastol) return false;

  lpRelaxation.getMipSolver().mipdata_->domain.tightenCoefficients(
      inds, vals, rowlen, rhs_);

  // if the cut is violated by a small factor above the feasibility
  // tolerance, add it to the cutpool
  HighsInt cutindex = cutpool.addCut(lpRelaxation.getMipSolver(), inds_.data(),
                                     vals_.data(), inds_.size(), rhs_,
                                     integralSupport && integralCoefficients);

  // only return true if cut was accepted by the cutpool, i.e. not a duplicate
  // of a cut already in the pool
  return cutindex != -1;
}